

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

void Mem_FlexRestart(Mem_Flex_t *p)

{
  char *pcVar1;
  long lVar2;
  
  if (p->nChunks != 0) {
    if (1 < p->nChunks) {
      lVar2 = 1;
      do {
        if (p->pChunks[lVar2] != (char *)0x0) {
          free(p->pChunks[lVar2]);
          p->pChunks[lVar2] = (char *)0x0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < p->nChunks);
    }
    p->nChunks = 1;
    p->nMemoryAlloc = p->nChunkSize;
    pcVar1 = *p->pChunks;
    p->pCurrent = pcVar1;
    p->pEnd = pcVar1 + p->nChunkSize;
    p->nEntriesUsed = 0;
    p->nMemoryUsed = 0;
  }
  return;
}

Assistant:

void Mem_FlexRestart( Mem_Flex_t * p )
{
    int i;
    if ( p->nChunks == 0 )
        return;
    // deallocate all chunks except the first one
    for ( i = 1; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    p->nChunks  = 1;
    p->nMemoryAlloc = p->nChunkSize;
    // transform these entries into a linked list
    p->pCurrent = p->pChunks[0];
    p->pEnd     = p->pCurrent + p->nChunkSize;
    p->nEntriesUsed = 0;
    p->nMemoryUsed = 0;
}